

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

void __thiscall
cppjieba::DictTrie::Init
          (DictTrie *this,string *dict_path,string *user_dict_paths,
          UserWordWeightOption user_word_weight_opt)

{
  pointer pDVar1;
  double *pdVar2;
  long lVar3;
  double sum;
  
  LoadDict(this,dict_path);
  pDVar1 = (this->static_node_infos_).
           super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->static_node_infos_).
                super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pDVar1;
  if (lVar3 == 0) {
    sum = 0.0;
  }
  else {
    lVar3 = lVar3 >> 7;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    pdVar2 = &pDVar1->weight;
    sum = 0.0;
    do {
      sum = sum + *pdVar2;
      pdVar2 = pdVar2 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  this->freq_sum_ = sum;
  CalculateWeight(this,&this->static_node_infos_,sum);
  SetStaticWordWeights(this,user_word_weight_opt);
  if (user_dict_paths->_M_string_length != 0) {
    LoadUserDict(this,user_dict_paths);
  }
  Shrink(this,&this->static_node_infos_);
  CreateTrie(this,&this->static_node_infos_);
  return;
}

Assistant:

void Init(const string& dict_path, const string& user_dict_paths, UserWordWeightOption user_word_weight_opt) {
    LoadDict(dict_path);
    freq_sum_ = CalcFreqSum(static_node_infos_);
    CalculateWeight(static_node_infos_, freq_sum_);
    SetStaticWordWeights(user_word_weight_opt);

    if (user_dict_paths.size()) {
      LoadUserDict(user_dict_paths);
    }
    Shrink(static_node_infos_);
    CreateTrie(static_node_infos_);
  }